

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall spvtools::opt::IRContext::IsConsistent(IRContext *this)

{
  bool bVar1;
  DefUseManager *lhs;
  type this_00;
  mapped_type *ppFVar2;
  reference this_01;
  reference this_02;
  DecorationManager *lhs_00;
  Module *pMVar3;
  type b;
  undefined1 local_228 [8];
  FeatureManager current_1;
  DecorationManager current;
  DecorationManager *dec_mgr;
  reference local_180;
  function<bool_(spvtools::opt::Instruction_*)> local_178;
  reference local_158;
  value_type *block;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  value_type *func;
  iterator __end3_1;
  iterator __begin3_1;
  Module *__range3_1;
  reference local_f0;
  value_type *fn;
  iterator __end3;
  iterator __begin3;
  Module *__range3;
  undefined1 local_b8 [8];
  DefUseManager new_def_use;
  IRContext *this_local;
  
  new_def_use.inst_to_used_ids_._M_h._M_single_bucket = (__node_base_ptr)this;
  bVar1 = AreAnalysesValid(this,kAnalysisBegin);
  if (bVar1) {
    pMVar3 = module(this);
    analysis::DefUseManager::DefUseManager((DefUseManager *)local_b8,pMVar3);
    lhs = get_def_use_mgr(this);
    bVar1 = analysis::CompareAndPrintDifferences(lhs,(DefUseManager *)local_b8);
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    analysis::DefUseManager::~DefUseManager((DefUseManager *)local_b8);
    if (!bVar1) goto LAB_003ce95c;
  }
  bVar1 = AreAnalysesValid(this,kAnalysisIdToFuncMapping);
  if (bVar1) {
    this_00 = std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::
              operator*(&this->module_);
    join_0x00000010_0x00000000_ = Module::begin(this_00);
    _fn = Module::end(this_00);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn), bVar1) {
      local_f0 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end3.iterator_)
      ;
      __range3_1._4_4_ = Function::result_id(local_f0);
      ppFVar2 = std::
                unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
                ::operator[](&this->id_to_func_,(key_type *)((long)&__range3_1 + 4));
      if (*ppFVar2 != local_f0) {
        this_local._7_1_ = 0;
        goto LAB_003ce95c;
      }
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end3.iterator_);
    }
  }
  bVar1 = AreAnalysesValid(this,kAnalysisInstrToBlockMapping);
  if (bVar1) {
    pMVar3 = module(this);
    join_0x00000010_0x00000000_ = Module::begin(pMVar3);
    _func = Module::end(pMVar3);
    while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end3_1.iterator_,
                              (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
      this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end3_1.iterator_
                          );
      join_0x00000010_0x00000000_ = Function::begin(this_01);
      _block = Function::end(this_01);
      while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                               ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                                &__end4.iterator_,
                                (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block),
            bVar1) {
        this_02 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                             &__end4.iterator_);
        dec_mgr = (DecorationManager *)this;
        local_180 = this_02;
        local_158 = this_02;
        std::function<bool(spvtools::opt::Instruction*)>::
        function<spvtools::opt::IRContext::IsConsistent()::__0,void>
                  ((function<bool(spvtools::opt::Instruction*)> *)&local_178,
                   (anon_class_16_2_f791057a *)&dec_mgr);
        bVar1 = BasicBlock::WhileEachInst(this_02,&local_178,false);
        std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_178);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = 0;
          goto LAB_003ce95c;
        }
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end4.iterator_);
      }
      UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end3_1.iterator_);
    }
  }
  bVar1 = CheckCFG(this);
  if (bVar1) {
    bVar1 = AreAnalysesValid(this,kAnalysisDecorations);
    if (bVar1) {
      lhs_00 = get_decoration_mgr(this);
      pMVar3 = module(this);
      analysis::DecorationManager::DecorationManager
                ((DecorationManager *)&current_1.extinst_importid_Shader100DebugInfo_,pMVar3);
      bVar1 = analysis::operator!=
                        (lhs_00,(DecorationManager *)&current_1.extinst_importid_Shader100DebugInfo_
                        );
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      analysis::DecorationManager::~DecorationManager
                ((DecorationManager *)&current_1.extinst_importid_Shader100DebugInfo_);
      if (bVar1) goto LAB_003ce95c;
    }
    bVar1 = std::operator!=(&this->feature_mgr_,(nullptr_t)0x0);
    if (bVar1) {
      FeatureManager::FeatureManager((FeatureManager *)local_228,&this->grammar_);
      pMVar3 = module(this);
      FeatureManager::Analyze((FeatureManager *)local_228,pMVar3);
      b = std::
          unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ::operator*(&this->feature_mgr_);
      bVar1 = opt::operator!=((FeatureManager *)local_228,b);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      FeatureManager::~FeatureManager((FeatureManager *)local_228);
      if (bVar1) goto LAB_003ce95c;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_003ce95c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool IRContext::IsConsistent() {
#ifndef SPIRV_CHECK_CONTEXT
  return true;
#else
  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager new_def_use(module());
    if (!CompareAndPrintDifferences(*get_def_use_mgr(), new_def_use)) {
      return false;
    }
  }

  if (AreAnalysesValid(kAnalysisIdToFuncMapping)) {
    for (auto& fn : *module_) {
      if (id_to_func_[fn.result_id()] != &fn) {
        return false;
      }
    }
  }

  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    for (auto& func : *module()) {
      for (auto& block : func) {
        if (!block.WhileEachInst([this, &block](Instruction* inst) {
              if (get_instr_block(inst) != &block) {
                return false;
              }
              return true;
            }))
          return false;
      }
    }
  }

  if (!CheckCFG()) {
    return false;
  }

  if (AreAnalysesValid(kAnalysisDecorations)) {
    analysis::DecorationManager* dec_mgr = get_decoration_mgr();
    analysis::DecorationManager current(module());

    if (*dec_mgr != current) {
      return false;
    }
  }

  if (feature_mgr_ != nullptr) {
    FeatureManager current(grammar_);
    current.Analyze(module());

    if (current != *feature_mgr_) {
      return false;
    }
  }
  return true;
#endif
}